

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
cppnet::List<cppnet::BufferBlock>::PushBack
          (List<cppnet::BufferBlock> *this,shared_ptr<cppnet::BufferBlock> *v)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<cppnet::BufferBlock> local_48 [2];
  shared_ptr<cppnet::BufferBlock> local_28;
  shared_ptr<cppnet::BufferBlock> *local_18;
  shared_ptr<cppnet::BufferBlock> *v_local;
  List<cppnet::BufferBlock> *this_local;
  
  local_18 = v;
  v_local = (shared_ptr<cppnet::BufferBlock> *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)v);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_tail);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_tail);
      std::shared_ptr<cppnet::BufferBlock>::shared_ptr(&local_28,v);
      ListSlot<cppnet::BufferBlock>::SetNext(&peVar2->super_ListSlot<cppnet::BufferBlock>,&local_28)
      ;
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr(&local_28);
      peVar2 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)v);
      std::shared_ptr<cppnet::BufferBlock>::shared_ptr(local_48,&this->_tail);
      ListSlot<cppnet::BufferBlock>::SetPrev(&peVar2->super_ListSlot<cppnet::BufferBlock>,local_48);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr(local_48);
      std::shared_ptr<cppnet::BufferBlock>::operator=(&this->_tail,v);
    }
    else {
      std::shared_ptr<cppnet::BufferBlock>::operator=(&this->_tail,v);
      std::shared_ptr<cppnet::BufferBlock>::operator=(&this->_head,v);
    }
    this->_size = this->_size + 1;
  }
  return;
}

Assistant:

void PushBack(std::shared_ptr<T> v) {
        if (!v) {
            return;
        }
    
        if (!_tail) {
            _tail = v;
            _head = v;

        } else {
            _tail->SetNext(v);
            v->SetPrev(_tail);
            _tail = v;
        }
        _size++;
    }